

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareRootUnscentedKalmanFilter.cpp
# Opt level: O0

void __thiscall
SquareRootUnscentedKalmanFilter_computeKalmanGain_Test::TestBody
          (SquareRootUnscentedKalmanFilter_computeKalmanGain_Test *this)

{
  float fVar1;
  bool bVar2;
  ComputationInfo CVar3;
  CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> *pCVar4;
  CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *pCVar5;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *pCVar6;
  char *pcVar7;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this_00;
  CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *pCVar8;
  CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *pCVar9;
  long lVar10;
  Index IVar11;
  Scalar *pSVar12;
  char *in_R9;
  AssertHelper local_498;
  Message local_490;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_2;
  int j;
  int i;
  Message local_468;
  Index local_460;
  Index local_458;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_1;
  Message local_438;
  Index local_430;
  Index local_428;
  undefined1 local_420 [8];
  AssertionResult gtest_ar;
  Matrix<T,_3,_2> K;
  Scalar local_3f0;
  Scalar local_3ec;
  Scalar local_3e8;
  Scalar local_3e4;
  CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> local_3e0;
  undefined1 local_3c0 [8];
  Matrix<T,_3,_2> K_ref;
  Scalar local_3a0;
  Scalar local_39c;
  Scalar local_398;
  Scalar local_394;
  CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> local_390;
  undefined1 local_36c [8];
  Matrix<T,_3,_2> P_xy_ref;
  Scalar local_34c;
  Scalar local_348;
  Scalar local_344;
  Scalar local_340;
  Scalar local_33c;
  Scalar local_338;
  Scalar local_334;
  Scalar local_330;
  Scalar local_32c;
  Scalar local_328;
  Scalar local_324;
  Scalar local_320;
  Scalar local_31c;
  Scalar local_318;
  Scalar local_314;
  Scalar local_310;
  Scalar local_30c;
  Scalar local_308;
  Scalar local_304;
  CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> local_300;
  Scalar local_2dc;
  Scalar local_2d8;
  Scalar local_2d4;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> local_2d0;
  uint local_2ac;
  string local_2a8;
  AssertHelper local_288;
  Message local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_;
  Cholesky<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> S;
  Scalar local_240;
  Scalar local_23c;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> local_238;
  undefined1 local_218 [8];
  Matrix<T,_2,_2> Ssquared;
  Scalar local_200;
  Scalar local_1fc;
  Scalar local_1f8;
  Scalar local_1f4;
  Scalar local_1f0;
  Scalar local_1ec;
  Scalar local_1e8;
  Scalar local_1e4;
  Scalar local_1e0;
  Scalar local_1dc;
  Scalar local_1d8;
  Scalar local_1d4;
  CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> local_1d0;
  undefined1 local_1b0 [8];
  template_SigmaPoints<decltype(mean)> sigmaPoints;
  CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> local_170;
  Vector<float,_2> local_14c;
  Vector<float,_2> mean;
  Scalar local_13c;
  Scalar local_138;
  Scalar local_134;
  Scalar local_130 [5];
  Scalar local_11c;
  CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> local_118;
  undefined1 local_f8 [8];
  SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  T kappa;
  T beta;
  T alpha;
  SquareRootUnscentedKalmanFilter_computeKalmanGain_Test *this_local;
  
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info = 0x40000000;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized = false;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._41_3_ = 0x3f8000;
  Kalman::SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
  SquareRootUnscentedKalmanFilter
            ((SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_f8,1.0,2.0,1.0);
  local_11c = 3.0;
  Eigen::DenseBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator<<
            (&local_118,
             (DenseBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> *)
             ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_m.
                     super_Matrix<float,_7,_1>.
                     super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.m_data +
             0x14),&local_11c);
  local_130[0] = 5.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (&local_118,local_130);
  local_134 = 5.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar4,&local_134);
  local_138 = 5.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar4,&local_138);
  local_13c = 5.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar4,&local_13c);
  mean.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[1] = 5.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar4,mean.super_Matrix<float,_2,_1>.
                             super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
                             m_data.array + 1);
  mean.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
  m_storage.m_data.array[0] = 5.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_(pCVar4,(Scalar *)&mean);
  Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::~CommaInitializer(&local_118);
  Kalman::Vector<float,_2>::Vector(&local_14c);
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
  [0xd] = 2.0;
  Eigen::DenseBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::operator<<
            (&local_170,(DenseBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)&local_14c,
             sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.
             m_data.array + 0xd);
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
  [0xc] = 3.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::operator_
            (&local_170,
             sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.
             m_data.array + 0xc);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_170);
  Eigen::Matrix<float,_2,_7,_0,_2,_7>::Matrix((Matrix<float,_2,_7,_0,_2,_7> *)local_1b0);
  local_1d4 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator<<
            (&local_1d0,(DenseBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *)local_1b0,&local_1d4);
  local_1d8 = 2.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (&local_1d0,&local_1d8);
  local_1dc = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar5,&local_1dc);
  local_1e0 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar5,&local_1e0);
  local_1e4 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar5,&local_1e4);
  local_1e8 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar5,&local_1e8);
  local_1ec = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar5,&local_1ec);
  local_1f0 = 2.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar5,&local_1f0);
  local_1f4 = 3.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar5,&local_1f4);
  local_1f8 = 3.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar5,&local_1f8);
  local_1fc = 2.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar5,&local_1fc);
  local_200 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar5,&local_200);
  Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3] =
       1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar5,Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.
                             m_storage.m_data.array + 3);
  Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2] =
       2.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
            (pCVar5,Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.
                    m_data.array + 2);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::~CommaInitializer(&local_1d0);
  Eigen::Matrix<float,_2,_2,_0,_2,_2>::Matrix((Matrix<float,_2,_2,_0,_2,_2> *)local_218);
  local_23c = 35.0;
  Eigen::DenseBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator<<
            (&local_238,(DenseBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_218,&local_23c);
  local_240 = 34.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     (&local_238,&local_240);
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>._28_4_ = 0x42080000;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar6,(Scalar *)
                             &S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.field_0x1c);
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_info = 0x42380000;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
            (pCVar6,(Scalar *)&S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_info);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::~CommaInitializer(&local_238);
  Kalman::Cholesky<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>::Cholesky
            ((Cholesky<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> *)&gtest_ar_.message_);
  Eigen::LLT<Eigen::Matrix<float,2,2,0,2,2>,1>::compute<Eigen::Matrix<float,2,2,0,2,2>>
            ((LLT<Eigen::Matrix<float,2,2,0,2,2>,1> *)&gtest_ar_.message_,
             (EigenBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_218);
  CVar3 = Eigen::LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>::info
                    ((LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_278,CVar3 == Success);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar2) {
    testing::Message::Message(&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2a8,(internal *)local_278,(AssertionResult *)"S.info() == Eigen::Success",
               "false","true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
               ,0x76,pcVar7);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    testing::Message::~Message(&local_280);
  }
  local_2ac = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  if (local_2ac == 0) {
    local_2d4 = 3.0;
    Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator<<
              (&local_2d0,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_f8,&local_2d4);
    local_2d8 = 5.0;
    this_00 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                        (&local_2d0,&local_2d8);
    local_2dc = 7.0;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(this_00,&local_2dc);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_2d0);
    local_304 = 3.0;
    Eigen::DenseBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator<<
              (&local_300,
               (DenseBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *)
               ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_c
                       .super_Matrix<float,_7,_1>.
                       super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.m_data
               + 0x14),&local_304);
    local_308 = 5.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (&local_300,&local_308);
    local_30c = 3.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,&local_30c);
    local_310 = 3.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,&local_310);
    local_314 = 1.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,&local_314);
    local_318 = 3.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,&local_318);
    local_31c = 3.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,&local_31c);
    local_320 = 5.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,&local_320);
    local_324 = 7.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,&local_324);
    local_328 = 7.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,&local_328);
    local_32c = 5.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,&local_32c);
    local_330 = 3.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,&local_330);
    local_334 = 3.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,&local_334);
    local_338 = 5.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,&local_338);
    local_33c = 7.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,&local_33c);
    local_340 = 11.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,&local_340);
    local_344 = 9.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,&local_344);
    local_348 = 9.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,&local_348);
    local_34c = 3.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,&local_34c);
    P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] =
         5.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar8,P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                               m_storage.m_data.array + 5);
    P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
         5.0;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
              (pCVar8,P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage
                      .m_data.array + 4);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::~CommaInitializer(&local_300);
    Eigen::Matrix<float,_3,_2,_0,_3,_2>::Matrix((Matrix<float,_3,_2,_0,_3,_2> *)local_36c);
    local_394 = 20.0;
    Eigen::DenseBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator<<
              (&local_390,(DenseBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_36c,&local_394);
    local_398 = 20.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (&local_390,&local_398);
    local_39c = 20.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar9,&local_39c);
    local_3a0 = 40.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar9,&local_3a0);
    K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] =
         40.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar9,K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                               m_storage.m_data.array + 5);
    K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
         60.0;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
              (pCVar9,K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.
                      m_data.array + 4);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::~CommaInitializer(&local_390);
    Eigen::Matrix<float,_3,_2,_0,_3,_2>::Matrix((Matrix<float,_3,_2,_0,_3,_2> *)local_3c0);
    local_3e4 = 0.52863437;
    Eigen::DenseBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator<<
              (&local_3e0,(DenseBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_3c0,&local_3e4);
    local_3e8 = 0.04405286;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (&local_3e0,&local_3e8);
    local_3ec = -0.969163;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar9,&local_3ec);
    local_3f0 = 1.585903;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar9,&local_3f0);
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] =
         -0.44052863;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar9,K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                               m_storage.m_data.array + 5);
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
         1.6299559;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
              (pCVar9,K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data
                      .array + 4);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::~CommaInitializer(&local_3e0);
    Eigen::Matrix<float,_3,_2,_0,_3,_2>::Matrix((Matrix<float,_3,_2,_0,_3,_2> *)&gtest_ar.message_);
    Kalman::SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
    computeKalmanGain<Kalman::Vector<float,_2>_>
              ((SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_f8,&local_14c,
               (SigmaPoints<Kalman::Vector<float,_2>_> *)local_1b0,
               (CovarianceSquareRoot<Kalman::Vector<float,_2>_> *)&gtest_ar_.message_,
               (KalmanGain<Kalman::Vector<float,_2>_> *)&gtest_ar.message_);
    local_428 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::rows
                          ((PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_3c0);
    local_430 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::rows
                          ((PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)
                           &gtest_ar.message_);
    testing::internal::EqHelper<false>::Compare<long,long>
              ((EqHelper<false> *)local_420,"K_ref.rows()","K.rows()",&local_428,&local_430);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
    if (!bVar2) {
      testing::Message::Message(&local_438);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                 ,0x91,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_438);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_438);
    }
    local_2ac = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
    if (local_2ac == 0) {
      local_458 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::cols
                            ((PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_3c0);
      local_460 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::cols
                            ((PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)
                             &gtest_ar.message_);
      testing::internal::EqHelper<false>::Compare<long,long>
                ((EqHelper<false> *)local_450,"K_ref.cols()","K.cols()",&local_458,&local_460);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
      if (!bVar2) {
        testing::Message::Message(&local_468);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&j,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                   ,0x91,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&j,&local_468);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&j);
        testing::Message::~Message(&local_468);
      }
      local_2ac = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
      if (local_2ac == 0) {
        for (gtest_ar_2.message_.ptr_._4_4_ = 0; lVar10 = (long)gtest_ar_2.message_.ptr_._4_4_,
            IVar11 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::rows
                               ((PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_3c0),
            lVar10 < IVar11; gtest_ar_2.message_.ptr_._4_4_ = gtest_ar_2.message_.ptr_._4_4_ + 1) {
          for (gtest_ar_2.message_.ptr_._0_4_ = 0; lVar10 = (long)(int)gtest_ar_2.message_.ptr_,
              IVar11 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::cols
                                 ((PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_3c0
                                 ), lVar10 < IVar11;
              gtest_ar_2.message_.ptr_._0_4_ = (int)gtest_ar_2.message_.ptr_ + 1) {
            pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_1> *)
                                 local_3c0,(long)gtest_ar_2.message_.ptr_._4_4_,
                                 (long)(int)gtest_ar_2.message_.ptr_);
            fVar1 = *pSVar12;
            pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_1> *)
                                 &gtest_ar.message_,(long)gtest_ar_2.message_.ptr_._4_4_,
                                 (long)(int)gtest_ar_2.message_.ptr_);
            testing::internal::DoubleNearPredFormat
                      ((internal *)local_488,"K_ref(i,j)","K(i,j)","1e-6",(double)fVar1,
                       (double)*pSVar12,1e-06);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
            if (!bVar2) {
              testing::Message::Message(&local_490);
              pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
              testing::internal::AssertHelper::AssertHelper
                        (&local_498,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                         ,0x91,pcVar7);
              testing::internal::AssertHelper::operator=(&local_498,&local_490);
              testing::internal::AssertHelper::~AssertHelper(&local_498);
              testing::Message::~Message(&local_490);
            }
            local_2ac = (uint)!bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
            if (local_2ac != 0) goto LAB_003b29e0;
          }
        }
        local_2ac = 0;
      }
    }
  }
LAB_003b29e0:
  Kalman::Cholesky<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>::~Cholesky
            ((Cholesky<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> *)&gtest_ar_.message_);
  Kalman::SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
  ~SquareRootUnscentedKalmanFilter
            ((SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_f8);
  return;
}

Assistant:

TEST(SquareRootUnscentedKalmanFilter, computeKalmanGain) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = SquareRootUnscentedKalmanFilter<Vector<T, 3>>(alpha,beta,kappa);
    
    ukf.sigmaWeights_c << 3, 5, 5, 5, 5, 5, 5;
    
    Vector<T,2> mean;
    mean << 2, 3;
    
    typename SquareRootUnscentedKalmanFilter<Vector<T, 3>>::template SigmaPoints<decltype(mean)> sigmaPoints;
    sigmaPoints <<
        1,  2,  1,  1,  0,  1,  1,
        2,  3,  3,  2,  1,  1,  2;
    
    Matrix<T,2,2> Ssquared;
    Ssquared <<
        35, 34,
        34, 46;
        
    Cholesky<Matrix<T,2,2>> S;
    S.compute(Ssquared);
    ASSERT_TRUE(S.info() == Eigen::Success);
    
    // x and sigmaStatePoints
    ukf.x << 3, 5, 7;
    ukf.sigmaStatePoints <<
        3,  5, 3, 3, 1, 3, 3,
        5,  7, 7, 5, 3, 3, 5,
        7, 11, 9, 9, 3, 5, 5;
    
    // Reference value for P
    Matrix<T,3,2> P_xy_ref;
    P_xy_ref <<
        20, 20,
        20, 40,
        40, 60;
    
    // Reference value for K
    Matrix<T, 3, 2> K_ref;
    K_ref <<
        0.528634361233480, 0.044052863436123,
       -0.969162995594713, 1.585903083700440,
       -0.440528634361233, 1.629955947136563;
    
    // Kalman gain to be computed
    Matrix<T, 3, 2> K;
    ukf.computeKalmanGain(mean, sigmaPoints, S, K);
    
    ASSERT_MATRIX_NEAR(K_ref, K, 1e-6);
}